

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

void bench_verify(void *arg,int iters)

{
  int iVar1;
  uint uVar2;
  int in_ESI;
  undefined8 *in_RDI;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  bench_data *data;
  int i;
  undefined1 auStack_98 [64];
  undefined1 local_58 [64];
  undefined8 *local_18;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_18 = in_RDI;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_10) {
      return;
    }
    *(byte *)((long)local_18 + local_18[0x12] + 0x47) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x47) ^ (byte)local_10;
    *(byte *)((long)local_18 + local_18[0x12] + 0x46) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x46) ^ (byte)((uint)local_10 >> 8);
    *(byte *)((long)local_18 + local_18[0x12] + 0x45) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x45) ^ (byte)((uint)local_10 >> 0x10);
    iVar1 = secp256k1_ec_pubkey_parse(*local_18,local_58,local_18 + 0x13,local_18[0x18]);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench.c"
              ,0x5e,
              "test condition failed: secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_ecdsa_signature_parse_der(*local_18,auStack_98,local_18 + 9,local_18[0x12]);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench.c"
              ,0x5f,
              "test condition failed: secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1"
             );
      abort();
    }
    uVar2 = secp256k1_ecdsa_verify(*local_18,auStack_98,local_18 + 1,local_58);
    if (uVar2 != (local_10 == 0)) break;
    *(byte *)((long)local_18 + local_18[0x12] + 0x47) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x47) ^ (byte)local_10;
    *(byte *)((long)local_18 + local_18[0x12] + 0x46) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x46) ^ (byte)((uint)local_10 >> 8);
    *(byte *)((long)local_18 + local_18[0x12] + 0x45) =
         *(byte *)((long)local_18 + local_18[0x12] + 0x45) ^ (byte)((uint)local_10 >> 0x10);
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench.c",
          0x60,
          "test condition failed: secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0)"
         );
  abort();
}

Assistant:

static void bench_verify(void* arg, int iters) {
    int i;
    bench_data* data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_pubkey pubkey;
        secp256k1_ecdsa_signature sig;
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
        CHECK(secp256k1_ec_pubkey_parse(data->ctx, &pubkey, data->pubkey, data->pubkeylen) == 1);
        CHECK(secp256k1_ecdsa_signature_parse_der(data->ctx, &sig, data->sig, data->siglen) == 1);
        CHECK(secp256k1_ecdsa_verify(data->ctx, &sig, data->msg, &pubkey) == (i == 0));
        data->sig[data->siglen - 1] ^= (i & 0xFF);
        data->sig[data->siglen - 2] ^= ((i >> 8) & 0xFF);
        data->sig[data->siglen - 3] ^= ((i >> 16) & 0xFF);
    }
}